

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::deriveECDH(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
                   CK_OBJECT_HANDLE hBaseKey,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
                   CK_OBJECT_HANDLE_PTR phKey,CK_KEY_TYPE keyType,CK_BBOOL isOnToken,
                   CK_BBOOL isPrivate)

{
  long lVar1;
  ByteString *pBVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  CryptoFactory *pCVar8;
  undefined4 extraout_var;
  CK_RV CVar9;
  uchar *__dest;
  undefined1 *puVar10;
  size_t sVar11;
  byte *pbVar12;
  long *plVar13;
  undefined8 *puVar14;
  long in_RDX;
  long in_R8;
  ulong in_R9;
  bool bVar15;
  long *in_stack_00000008;
  long in_stack_00000010;
  char in_stack_00000020;
  OSObject *ossecret;
  size_t i_2;
  ByteString kcv;
  ByteString plainKCV;
  ByteString value;
  ByteString secretValue;
  bool bNeverExtractable;
  bool bAlwaysSensitive;
  bool bOK;
  OSObject *osobject;
  CK_ULONG i_1;
  CK_ULONG secretAttribsCount;
  CK_ATTRIBUTE secretAttribs [32];
  CK_OBJECT_CLASS objClass;
  CK_ULONG maxAttribs;
  CK_RV rv;
  SymmetricKey *secret;
  PublicKey *publicKey;
  ByteString publicData;
  PrivateKey *privateKey;
  AsymmetricAlgorithm *ecdh;
  OSObject *baseKey;
  CK_ULONG i;
  bool checkValue;
  size_t byteLen;
  Token *token;
  Session *session;
  undefined7 in_stack_fffffffffffff478;
  undefined1 in_stack_fffffffffffff47f;
  OSAttribute *in_stack_fffffffffffff480;
  ByteString *in_stack_fffffffffffff488;
  undefined6 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff496;
  undefined1 in_stack_fffffffffffff497;
  byte local_b5a;
  ByteString *in_stack_fffffffffffff4a8;
  uint7 in_stack_fffffffffffff4b0;
  undefined7 in_stack_fffffffffffff4c0;
  uchar in_stack_fffffffffffff4c7;
  HandleManager *in_stack_fffffffffffff4c8;
  ECPublicKey *in_stack_fffffffffffff4d0;
  SoftHSM *in_stack_fffffffffffff4d8;
  SoftHSM *in_stack_fffffffffffff4e0;
  byte local_ab2;
  byte local_aa4;
  byte local_a92;
  byte local_a84;
  OSObject *in_stack_fffffffffffff5b0;
  Token *in_stack_fffffffffffff5b8;
  undefined7 in_stack_fffffffffffff5c0;
  undefined1 in_stack_fffffffffffff5c7;
  SoftHSM *in_stack_fffffffffffff5c8;
  undefined1 local_9e0 [167];
  byte local_939;
  undefined1 local_938 [120];
  undefined1 local_898 [40];
  undefined1 local_870 [40];
  undefined1 local_848 [40];
  SoftHSM *local_820;
  undefined1 local_7f0 [40];
  char local_7c8 [40];
  undefined1 local_7a0 [40];
  char local_778 [47];
  byte local_749;
  undefined1 local_748 [167];
  byte local_6a1;
  undefined1 local_6a0 [166];
  undefined1 local_5fa;
  byte local_5f9;
  undefined1 local_5f8 [167];
  byte local_551;
  undefined1 local_550 [166];
  byte local_4aa;
  byte local_4a9;
  undefined1 local_4a8 [167];
  byte local_401;
  ByteString *local_400;
  ulong local_3f8;
  long local_3f0;
  undefined1 *local_3e8 [5];
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined1 *local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 *local_398;
  undefined8 local_390;
  undefined1 local_388 [444];
  int in_stack_fffffffffffffe34;
  CK_OBJECT_HANDLE_PTR in_stack_fffffffffffffe38;
  CK_ULONG in_stack_fffffffffffffe40;
  CK_ATTRIBUTE_PTR in_stack_fffffffffffffe48;
  CK_SESSION_HANDLE in_stack_fffffffffffffe50;
  SoftHSM *in_stack_fffffffffffffe58;
  undefined1 auStack_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  CK_RV local_d0;
  long *local_c8;
  undefined4 local_bc;
  long local_b8;
  long local_78;
  long *local_70;
  long *local_68;
  ulong local_60;
  byte local_51;
  ulong local_50;
  Token *local_48;
  Session *local_40;
  ulong local_38;
  long local_30;
  long local_20;
  CK_RV local_8;
  
  *in_stack_00000008 = 0;
  if ((*(long *)(in_RDX + 8) == 0) || (*(long *)(in_RDX + 0x10) != 0x28)) {
    softHSMLog(7,"deriveECDH",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2978,"pParameter must be of type CK_ECDH1_DERIVE_PARAMS");
    local_8 = 0x71;
  }
  else if (**(long **)(in_RDX + 8) == 1) {
    if ((*(long *)(*(long *)(in_RDX + 8) + 8) == 0) &&
       (*(long *)(*(long *)(in_RDX + 8) + 0x10) == 0)) {
      if ((*(long *)(*(long *)(in_RDX + 8) + 0x18) == 0) ||
         (*(long *)(*(long *)(in_RDX + 8) + 0x20) == 0)) {
        softHSMLog(7,"deriveECDH",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2989,"there must be a public data");
        local_8 = 0x71;
      }
      else {
        local_38 = in_R9;
        local_30 = in_R8;
        local_20 = in_RDX;
        local_40 = (Session *)
                   HandleManager::getSession
                             (in_stack_fffffffffffff4c8,
                              CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0));
        if (local_40 == (Session *)0x0) {
          local_8 = 0xb3;
        }
        else {
          local_48 = Session::getToken(local_40);
          if (local_48 == (Token *)0x0) {
            local_8 = 5;
          }
          else {
            local_50 = 0;
            local_51 = 1;
            for (local_60 = 0; local_60 < local_38; local_60 = local_60 + 1) {
              lVar1 = *(long *)(local_30 + local_60 * 0x18);
              if (lVar1 == 0x11) {
                softHSMLog(6,"deriveECDH",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x299f,"CKA_VALUE must not be included");
                return 0x10;
              }
              if (lVar1 == 0x90) {
                if (*(long *)(local_30 + local_60 * 0x18 + 0x10) != 0) {
                  softHSMLog(6,"deriveECDH",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                             ,0x29ac,"CKA_CHECK_VALUE must be a no-value (0 length) entry");
                  return 0x13;
                }
                local_51 = 0;
              }
              else if (lVar1 == 0x161) {
                if (*(long *)(local_30 + local_60 * 0x18 + 0x10) != 8) {
                  softHSMLog(6,"deriveECDH",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                             ,0x29a4,"CKA_VALUE_LEN does not have the size of CK_ULONG");
                  return 0x13;
                }
                local_50 = **(ulong **)(local_30 + local_60 * 0x18 + 8);
              }
            }
            switch(in_stack_00000010) {
            case 0x10:
              break;
            default:
              return 0x13;
            case 0x13:
              if ((local_50 != 0) && (local_50 != 8)) {
                softHSMLog(6,"deriveECDH",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x29c0,"CKA_VALUE_LEN must be 0 or 8");
                return 0x13;
              }
              local_50 = 8;
              break;
            case 0x14:
              if ((local_50 != 0) && (local_50 != 0x10)) {
                softHSMLog(6,"deriveECDH",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x29c9,"CKA_VALUE_LEN must be 0 or 16");
                return 0x13;
              }
              local_50 = 0x10;
              break;
            case 0x15:
              if ((local_50 != 0) && (local_50 != 0x18)) {
                softHSMLog(6,"deriveECDH",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x29d1,"CKA_VALUE_LEN must be 0 or 24");
                return 0x13;
              }
              local_50 = 0x18;
              break;
            case 0x1f:
              if ((((local_50 != 0) && (local_50 != 0x10)) && (local_50 != 0x18)) &&
                 (local_50 != 0x20)) {
                softHSMLog(6,"deriveECDH",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x29d9,"CKA_VALUE_LEN must be 0, 16, 24, or 32");
                return 0x13;
              }
            }
            local_68 = (long *)HandleManager::getObject
                                         (in_stack_fffffffffffff4c8,
                                          CONCAT17(in_stack_fffffffffffff4c7,
                                                   in_stack_fffffffffffff4c0));
            if ((local_68 == (long *)0x0) ||
               (uVar7 = (**(code **)(*local_68 + 0x50))(), (uVar7 & 1) == 0)) {
              local_8 = 0x60;
            }
            else {
              pCVar8 = CryptoFactory::i();
              iVar5 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,4);
              local_70 = (long *)CONCAT44(extraout_var,iVar5);
              if (local_70 == (long *)0x0) {
                local_8 = 0x70;
              }
              else {
                local_78 = (**(code **)(*local_70 + 0xb0))();
                if (local_78 == 0) {
                  pCVar8 = CryptoFactory::i();
                  (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_70);
                  local_8 = 2;
                }
                else {
                  CVar9 = getECPrivateKey(in_stack_fffffffffffff5c8,
                                          (ECPrivateKey *)
                                          CONCAT17(in_stack_fffffffffffff5c7,
                                                   in_stack_fffffffffffff5c0),
                                          in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
                  if (CVar9 == 0) {
                    ByteString::ByteString((ByteString *)0x190543);
                    ByteString::resize((ByteString *)in_stack_fffffffffffff480,
                                       CONCAT17(in_stack_fffffffffffff47f,in_stack_fffffffffffff478)
                                      );
                    __dest = ByteString::operator[]
                                       ((ByteString *)in_stack_fffffffffffff480,
                                        CONCAT17(in_stack_fffffffffffff47f,in_stack_fffffffffffff478
                                                ));
                    memcpy(__dest,*(void **)(*(long *)(local_20 + 8) + 0x20),
                           *(size_t *)(*(long *)(local_20 + 8) + 0x18));
                    local_b8 = (**(code **)(*local_70 + 0xa8))();
                    if (local_b8 == 0) {
                      (**(code **)(*local_70 + 0xd8))(local_70,local_78);
                      pCVar8 = CryptoFactory::i();
                      (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_70);
                      local_8 = 2;
                    }
                    else {
                      CVar9 = getECDHPublicKey(in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0,
                                               (ECPrivateKey *)in_stack_fffffffffffff4c8,
                                               (ByteString *)
                                               CONCAT17(in_stack_fffffffffffff4c7,
                                                        in_stack_fffffffffffff4c0));
                      if (CVar9 == 0) {
                        local_c8 = (long *)0x0;
                        local_d0 = 0;
                        bVar4 = (**(code **)(*local_70 + 0x80))
                                          (local_70,&local_c8,local_b8,local_78);
                        if ((bVar4 & 1) == 0) {
                          local_d0 = 5;
                        }
                        (**(code **)(*local_70 + 0xd8))(local_70,local_78);
                        (**(code **)(*local_70 + 0xd0))();
                        local_d8 = 0x20;
                        local_e0 = 4;
                        memset(local_3e8,0,0x300);
                        local_3e8[1] = (undefined1 *)&local_e0;
                        local_3e8[2] = (undefined1 *)0x8;
                        local_3e8[3] = (undefined1 *)0x1;
                        local_3e8[4] = &stack0x00000018;
                        local_3c0 = 1;
                        local_3b8 = 2;
                        local_3b0 = &stack0x00000020;
                        local_3a8 = 1;
                        local_3a0 = 0x100;
                        local_398 = &stack0x00000010;
                        local_390 = 8;
                        puVar10 = local_388;
                        do {
                          puVar10 = puVar10 + 0x18;
                        } while (puVar10 != auStack_e8);
                        local_3f0 = 4;
                        if (0x1c < local_38) {
                          local_d0 = 0xd1;
                        }
                        for (local_3f8 = 0; local_3f8 < local_38 && local_d0 == 0;
                            local_3f8 = local_3f8 + 1) {
                          uVar7 = *(ulong *)(local_30 + local_3f8 * 0x18);
                          if (((2 < uVar7) && (uVar7 != 0x90)) && (uVar7 != 0x100)) {
                            puVar14 = (undefined8 *)(local_30 + local_3f8 * 0x18);
                            local_3e8[local_3f0 * 3] = (undefined1 *)*puVar14;
                            local_3e8[local_3f0 * 3 + 1] = (undefined1 *)puVar14[1];
                            local_3e8[local_3f0 * 3 + 2] = (undefined1 *)puVar14[2];
                            local_3f0 = local_3f0 + 1;
                          }
                        }
                        if (local_d0 == 0) {
                          local_d0 = CreateObject(in_stack_fffffffffffffe58,
                                                  in_stack_fffffffffffffe50,
                                                  in_stack_fffffffffffffe48,
                                                  in_stack_fffffffffffffe40,
                                                  in_stack_fffffffffffffe38,
                                                  in_stack_fffffffffffffe34);
                        }
                        if (local_d0 == 0) {
                          local_400 = (ByteString *)
                                      HandleManager::getObject
                                                (in_stack_fffffffffffff4c8,
                                                 CONCAT17(in_stack_fffffffffffff4c7,
                                                          in_stack_fffffffffffff4c0));
                          if ((local_400 == (ByteString *)0x0) ||
                             (uVar6 = (*local_400->_vptr_ByteString[10])(), (uVar6 & 1) == 0)) {
                            local_d0 = 6;
                          }
                          else {
                            uVar6 = (*local_400->_vptr_ByteString[0xb])(local_400,1);
                            pBVar2 = local_400;
                            if ((uVar6 & 1) == 0) {
                              local_d0 = 6;
                            }
                            else {
                              local_401 = 1;
                              local_4a9 = 0;
                              OSAttribute::OSAttribute
                                        (in_stack_fffffffffffff480,(bool)in_stack_fffffffffffff47f);
                              local_4a9 = 1;
                              iVar5 = (*pBVar2->_vptr_ByteString[8])(pBVar2,0x163,local_4a8);
                              local_401 = (byte)iVar5 & 1;
                              if ((local_4a9 & 1) != 0) {
                                OSAttribute::~OSAttribute(in_stack_fffffffffffff480);
                              }
                              bVar4 = (**(code **)(*local_68 + 0x20))(local_68,0x165,0);
                              pBVar2 = local_400;
                              if ((bVar4 & 1) == 0) {
                                local_5f9 = 0;
                                local_a92 = 0;
                                if ((local_401 & 1) != 0) {
                                  OSAttribute::OSAttribute
                                            (in_stack_fffffffffffff480,
                                             (bool)in_stack_fffffffffffff47f);
                                  local_5f9 = 1;
                                  iVar5 = (*pBVar2->_vptr_ByteString[8])(pBVar2,0x165,local_5f8);
                                  local_a92 = (byte)iVar5;
                                }
                                local_401 = local_a92 & 1;
                                if ((local_5f9 & 1) != 0) {
                                  OSAttribute::~OSAttribute(in_stack_fffffffffffff480);
                                }
                              }
                              else {
                                iVar5 = (*local_400->_vptr_ByteString[4])(local_400,0x103,0);
                                pBVar2 = local_400;
                                local_4aa = (byte)iVar5 & 1;
                                local_551 = 0;
                                local_a84 = 0;
                                if ((local_401 & 1) != 0) {
                                  OSAttribute::OSAttribute
                                            (in_stack_fffffffffffff480,
                                             (bool)in_stack_fffffffffffff47f);
                                  local_551 = 1;
                                  iVar5 = (*pBVar2->_vptr_ByteString[8])(pBVar2,0x165,local_550);
                                  local_a84 = (byte)iVar5;
                                }
                                local_401 = local_a84 & 1;
                                if ((local_551 & 1) != 0) {
                                  OSAttribute::~OSAttribute(in_stack_fffffffffffff480);
                                }
                              }
                              bVar4 = (**(code **)(*local_68 + 0x20))(local_68,0x164,1);
                              pBVar2 = local_400;
                              if ((bVar4 & 1) == 0) {
                                local_749 = 0;
                                local_ab2 = 0;
                                if ((local_401 & 1) != 0) {
                                  OSAttribute::OSAttribute
                                            (in_stack_fffffffffffff480,
                                             (bool)in_stack_fffffffffffff47f);
                                  local_749 = 1;
                                  iVar5 = (*pBVar2->_vptr_ByteString[8])(pBVar2,0x164,local_748);
                                  local_ab2 = (byte)iVar5;
                                }
                                local_401 = local_ab2 & 1;
                                if ((local_749 & 1) != 0) {
                                  OSAttribute::~OSAttribute(in_stack_fffffffffffff480);
                                }
                              }
                              else {
                                uVar6 = (*local_400->_vptr_ByteString[4])(local_400,0x162,0);
                                pBVar2 = local_400;
                                local_5fa = (uVar6 & 1) == 0;
                                local_6a1 = 0;
                                local_aa4 = 0;
                                if ((local_401 & 1) != 0) {
                                  OSAttribute::OSAttribute
                                            (in_stack_fffffffffffff480,
                                             (bool)in_stack_fffffffffffff47f);
                                  local_6a1 = 1;
                                  iVar5 = (*pBVar2->_vptr_ByteString[8])(pBVar2,0x164,local_6a0);
                                  local_aa4 = (byte)iVar5;
                                }
                                local_401 = local_aa4 & 1;
                                if ((local_6a1 & 1) != 0) {
                                  OSAttribute::~OSAttribute(in_stack_fffffffffffff480);
                                }
                              }
                              (**(code **)(*local_c8 + 0x20))();
                              ByteString::ByteString
                                        ((ByteString *)
                                         CONCAT17(in_stack_fffffffffffff497,
                                                  CONCAT16(in_stack_fffffffffffff496,
                                                           in_stack_fffffffffffff490)),
                                         in_stack_fffffffffffff488);
                              ByteString::ByteString((ByteString *)0x19107a);
                              ByteString::ByteString((ByteString *)0x191089);
                              ByteString::ByteString((ByteString *)0x191098);
                              if (local_50 == 0) {
                                if (in_stack_00000010 == 0x10) {
                                  local_50 = ByteString::size((ByteString *)0x191130);
                                }
                                else if (in_stack_00000010 == 0x1f) {
                                  sVar11 = ByteString::size((ByteString *)0x191175);
                                  if (sVar11 < 0x20) {
                                    sVar11 = ByteString::size((ByteString *)0x1911a8);
                                    if (sVar11 < 0x18) {
                                      local_50 = 0x10;
                                    }
                                    else {
                                      local_50 = 0x18;
                                    }
                                  }
                                  else {
                                    local_50 = 0x20;
                                  }
                                }
                              }
                              uVar7 = local_50;
                              sVar11 = ByteString::size((ByteString *)0x1911fd);
                              uVar3 = local_50;
                              if (sVar11 < uVar7) {
                                softHSMLog(6,"deriveECDH",
                                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                           ,0x2a70,"The derived secret is too short");
                                local_401 = 0;
                              }
                              else {
                                sVar11 = ByteString::size((ByteString *)0x19126b);
                                if (uVar3 < sVar11) {
                                  ByteString::size((ByteString *)0x191294);
                                  ByteString::split((ByteString *)in_stack_fffffffffffff4c8,
                                                    CONCAT17(in_stack_fffffffffffff4c7,
                                                             in_stack_fffffffffffff4c0));
                                  ByteString::~ByteString((ByteString *)0x1912cf);
                                }
                                if (((in_stack_00000010 == 0x13) || (in_stack_00000010 == 0x14)) ||
                                   (in_stack_00000010 == 0x15)) {
                                  local_820 = (SoftHSM *)0x0;
                                  while (in_stack_fffffffffffff4d8 = local_820,
                                        in_stack_fffffffffffff4e0 =
                                             (SoftHSM *)ByteString::size((ByteString *)0x19131a),
                                        in_stack_fffffffffffff4d8 < in_stack_fffffffffffff4e0) {
                                    pbVar12 = ByteString::operator[]
                                                        ((ByteString *)in_stack_fffffffffffff480,
                                                         CONCAT17(in_stack_fffffffffffff47f,
                                                                  in_stack_fffffffffffff478));
                                    in_stack_fffffffffffff4c7 = odd_parity[*pbVar12];
                                    in_stack_fffffffffffff4c8 =
                                         (HandleManager *)
                                         ByteString::operator[]
                                                   ((ByteString *)in_stack_fffffffffffff480,
                                                    CONCAT17(in_stack_fffffffffffff47f,
                                                             in_stack_fffffffffffff478));
                                    *(uchar *)&in_stack_fffffffffffff4c8->_vptr_HandleManager =
                                         in_stack_fffffffffffff4c7;
                                    local_820 = (SoftHSM *)((long)&local_820->_vptr_SoftHSM + 1);
                                  }
                                }
                                if (in_stack_00000010 == 0x10) {
                                  (**(code **)(*local_c8 + 0x30))(local_c8,local_50 << 3);
                                  (**(code **)(*local_c8 + 0x28))(local_848);
                                  ByteString::operator=
                                            ((ByteString *)in_stack_fffffffffffff480,
                                             (ByteString *)
                                             CONCAT17(in_stack_fffffffffffff47f,
                                                      in_stack_fffffffffffff478));
                                  ByteString::~ByteString((ByteString *)0x191440);
                                }
                                else if (in_stack_00000010 - 0x13U < 3) {
                                  (**(code **)(*local_c8 + 0x30))(local_c8,local_50 * 7);
                                  (**(code **)(*local_c8 + 0x28))(local_870);
                                  ByteString::operator=
                                            ((ByteString *)in_stack_fffffffffffff480,
                                             (ByteString *)
                                             CONCAT17(in_stack_fffffffffffff47f,
                                                      in_stack_fffffffffffff478));
                                  ByteString::~ByteString((ByteString *)0x1914cf);
                                }
                                else if (in_stack_00000010 == 0x1f) {
                                  (**(code **)(*local_c8 + 0x30))(local_c8,local_50 << 3);
                                  (**(code **)(*local_c8 + 0x28))(local_898);
                                  ByteString::operator=
                                            ((ByteString *)in_stack_fffffffffffff480,
                                             (ByteString *)
                                             CONCAT17(in_stack_fffffffffffff47f,
                                                      in_stack_fffffffffffff478));
                                  ByteString::~ByteString((ByteString *)0x191558);
                                }
                                else {
                                  local_401 = 0;
                                }
                                if (in_stack_00000020 == '\0') {
                                  ByteString::operator=
                                            ((ByteString *)in_stack_fffffffffffff480,
                                             (ByteString *)
                                             CONCAT17(in_stack_fffffffffffff47f,
                                                      in_stack_fffffffffffff478));
                                  ByteString::operator=
                                            ((ByteString *)in_stack_fffffffffffff480,
                                             (ByteString *)
                                             CONCAT17(in_stack_fffffffffffff47f,
                                                      in_stack_fffffffffffff478));
                                }
                                else {
                                  Token::encrypt(local_48,local_778,(int)local_7a0);
                                  Token::encrypt(local_48,local_7c8,(int)local_7f0);
                                }
                              }
                              local_939 = 0;
                              bVar4 = 0;
                              if ((local_401 & 1) != 0) {
                                in_stack_fffffffffffff4a8 = local_400;
                                OSAttribute::OSAttribute
                                          ((OSAttribute *)(ulong)in_stack_fffffffffffff4b0,local_400
                                          );
                                local_939 = 1;
                                iVar5 = (*in_stack_fffffffffffff4a8->_vptr_ByteString[8])
                                                  (in_stack_fffffffffffff4a8,0x11,local_938);
                                bVar4 = (byte)iVar5;
                              }
                              local_401 = bVar4 & 1;
                              if ((local_939 & 1) != 0) {
                                OSAttribute::~OSAttribute(in_stack_fffffffffffff480);
                              }
                              pBVar2 = local_400;
                              if ((local_51 & 1) != 0) {
                                bVar15 = (local_401 & 1) != 0;
                                local_b5a = 0;
                                if (bVar15) {
                                  OSAttribute::OSAttribute
                                            ((OSAttribute *)
                                             CONCAT17(bVar4,in_stack_fffffffffffff4b0),
                                             in_stack_fffffffffffff4a8);
                                  iVar5 = (*pBVar2->_vptr_ByteString[8])(pBVar2,0x90,local_9e0);
                                  local_b5a = (byte)iVar5;
                                }
                                local_401 = local_b5a & 1;
                                if (bVar15) {
                                  OSAttribute::~OSAttribute(in_stack_fffffffffffff480);
                                }
                              }
                              if ((local_401 & 1) == 0) {
                                (*local_400->_vptr_ByteString[0xd])();
                              }
                              else {
                                iVar5 = (*local_400->_vptr_ByteString[0xc])();
                                local_401 = (byte)iVar5 & 1;
                              }
                              if ((local_401 & 1) == 0) {
                                local_d0 = 6;
                              }
                              ByteString::~ByteString((ByteString *)0x19180e);
                              ByteString::~ByteString((ByteString *)0x19181b);
                              ByteString::~ByteString((ByteString *)0x191828);
                              ByteString::~ByteString((ByteString *)0x191835);
                            }
                          }
                        }
                        (**(code **)(*local_70 + 0xe0))(local_70,local_c8);
                        pCVar8 = CryptoFactory::i();
                        (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_70);
                        if ((local_d0 != 0) && (*in_stack_00000008 != 0)) {
                          plVar13 = (long *)HandleManager::getObject
                                                      (in_stack_fffffffffffff4c8,
                                                       CONCAT17(in_stack_fffffffffffff4c7,
                                                                in_stack_fffffffffffff4c0));
                          HandleManager::destroyObject
                                    ((HandleManager *)in_stack_fffffffffffff4e0,
                                     (CK_OBJECT_HANDLE)in_stack_fffffffffffff4d8);
                          if (plVar13 != (long *)0x0) {
                            (**(code **)(*plVar13 + 0x70))();
                          }
                          *in_stack_00000008 = 0;
                        }
                        local_8 = local_d0;
                      }
                      else {
                        (**(code **)(*local_70 + 0xd8))(local_70,local_78);
                        (**(code **)(*local_70 + 0xd0))(local_70,local_b8);
                        pCVar8 = CryptoFactory::i();
                        (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_70);
                        local_8 = 5;
                      }
                    }
                    local_bc = 1;
                    ByteString::~ByteString((ByteString *)0x191986);
                  }
                  else {
                    (**(code **)(*local_70 + 0xd8))(local_70,local_78);
                    pCVar8 = CryptoFactory::i();
                    (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,local_70);
                    local_8 = 5;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      softHSMLog(7,"deriveECDH",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x2983,"there must be no shared data");
      local_8 = 0x71;
    }
  }
  else {
    softHSMLog(7,"deriveECDH",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x297d,"kdf must be CKD_NULL");
    local_8 = 0x71;
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::deriveECDH
(CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hBaseKey,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_KEY_TYPE keyType,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	if ((pMechanism->pParameter == NULL_PTR) ||
	    (pMechanism->ulParameterLen != sizeof(CK_ECDH1_DERIVE_PARAMS)))
	{
		DEBUG_MSG("pParameter must be of type CK_ECDH1_DERIVE_PARAMS");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->kdf != CKD_NULL)
	{
		DEBUG_MSG("kdf must be CKD_NULL");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if ((CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulSharedDataLen != 0) ||
	    (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pSharedData != NULL_PTR))
	{
		DEBUG_MSG("there must be no shared data");
		return CKR_MECHANISM_PARAM_INVALID;
	}
	if ((CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen == 0) ||
	    (CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pPublicData == NULL_PTR))
	{
		DEBUG_MSG("there must be a public data");
		return CKR_MECHANISM_PARAM_INVALID;
	}

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t byteLen = 0;
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_VALUE:
				INFO_MSG("CKA_VALUE must not be included");
				return CKR_ATTRIBUTE_READ_ONLY;
			case CKA_VALUE_LEN:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_VALUE_LEN does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				byteLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Check the length
	// byteLen == 0 impiles return max size the ECC can derive
	switch (keyType)
	{
		case CKK_GENERIC_SECRET:
			break;
#ifndef WITH_FIPS
		case CKK_DES:
			if (byteLen != 0 && byteLen != 8)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 8");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 8;
			break;
#endif
		case CKK_DES2:
			if (byteLen != 0 && byteLen != 16)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 16");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 16;
			break;
		case CKK_DES3:
			if (byteLen != 0 && byteLen != 24)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0 or 24");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			byteLen = 24;
			break;
		case CKK_AES:
			if (byteLen != 0 && byteLen != 16 && byteLen != 24 && byteLen != 32)
			{
				INFO_MSG("CKA_VALUE_LEN must be 0, 16, 24, or 32");
				return CKR_ATTRIBUTE_VALUE_INVALID;
			}
			break;
		default:
			return CKR_ATTRIBUTE_VALUE_INVALID;
	}

	// Get the base key handle
	OSObject *baseKey = (OSObject *)handleManager->getObject(hBaseKey);
	if (baseKey == NULL || !baseKey->isValid())
		return CKR_KEY_HANDLE_INVALID;

	// Get the ECDH algorithm handler
	AsymmetricAlgorithm* ecdh = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDH);
	if (ecdh == NULL)
		return CKR_MECHANISM_INVALID;

	// Get the keys
	PrivateKey* privateKey = ecdh->newPrivateKey();
	if (privateKey == NULL)
	{
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);
		return CKR_HOST_MEMORY;
	}
	if (getECPrivateKey((ECPrivateKey*)privateKey, token, baseKey) != CKR_OK)
	{
		ecdh->recyclePrivateKey(privateKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);
		return CKR_GENERAL_ERROR;
	}

	ByteString publicData;
	publicData.resize(CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen);
	memcpy(&publicData[0],
	       CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->pPublicData,
	       CK_ECDH1_DERIVE_PARAMS_PTR(pMechanism->pParameter)->ulPublicDataLen);
	PublicKey* publicKey = ecdh->newPublicKey();
	if (publicKey == NULL)
	{
		ecdh->recyclePrivateKey(privateKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);
		return CKR_HOST_MEMORY;
	}
	if (getECDHPublicKey((ECPublicKey*)publicKey, (ECPrivateKey*)privateKey, publicData) != CKR_OK)
	{
		ecdh->recyclePrivateKey(privateKey);
		ecdh->recyclePublicKey(publicKey);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);
		return CKR_GENERAL_ERROR;
	}

	// Derive the secret
	SymmetricKey* secret = NULL;
	CK_RV rv = CKR_OK;
	if (!ecdh->deriveKey(&secret, publicKey, privateKey))
		rv = CKR_GENERAL_ERROR;
	ecdh->recyclePrivateKey(privateKey);
	ecdh->recyclePublicKey(publicKey);

	// Create the secret object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_ATTRIBUTE secretAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG secretAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - secretAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			secretAttribs[secretAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, secretAttribs, secretAttribsCount, phKey, OBJECT_OP_DERIVE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,false);

			// Common Secret Key Attributes
			if (baseKey->getBooleanValue(CKA_ALWAYS_SENSITIVE, false))
			{
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			}
			else
			{
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,false);
			}
			if (baseKey->getBooleanValue(CKA_NEVER_EXTRACTABLE, true))
			{
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE,bNeverExtractable);
			}
			else
			{
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE,false);
			}

			// Secret Attributes
			ByteString secretValue = secret->getKeyBits();
			ByteString value;
			ByteString plainKCV;
			ByteString kcv;

			// For generic and AES keys:
			// default to return max size available.
			if (byteLen == 0)
			{
				switch (keyType)
				{
					case CKK_GENERIC_SECRET:
						byteLen = secretValue.size();
						break;
					case CKK_AES:
						if (secretValue.size() >= 32)
							byteLen = 32;
						else if (secretValue.size() >= 24)
							byteLen = 24;
						else
							byteLen = 16;
				}
			}

			if (byteLen > secretValue.size())
			{
				INFO_MSG("The derived secret is too short");
				bOK = false;
			}
			else
			{
				// Truncate value when requested, remove from the leading end
				if (byteLen < secretValue.size())
					secretValue.split(secretValue.size() - byteLen);

				// Fix the odd parity for DES
				if (keyType == CKK_DES ||
				    keyType == CKK_DES2 ||
				    keyType == CKK_DES3)
				{
					for (size_t i = 0; i < secretValue.size(); i++)
					{
						secretValue[i] = odd_parity[secretValue[i]];
					}
				}

				// Get the KCV
				switch (keyType)
				{
					case CKK_GENERIC_SECRET:
						secret->setBitLen(byteLen * 8);
						plainKCV = secret->getKeyCheckValue();
						break;
					case CKK_DES:
					case CKK_DES2:
					case CKK_DES3:
						secret->setBitLen(byteLen * 7);
						plainKCV = ((DESKey*)secret)->getKeyCheckValue();
						break;
					case CKK_AES:
						secret->setBitLen(byteLen * 8);
						plainKCV = ((AESKey*)secret)->getKeyCheckValue();
						break;
					default:
						bOK = false;
						break;
				}

				if (isPrivate)
				{
					token->encrypt(secretValue, value);
					token->encrypt(plainKCV, kcv);
				}
				else
				{
					value = secretValue;
					kcv = plainKCV;
				}
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	ecdh->recycleSymmetricKey(secret);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(ecdh);

	// Remove secret that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* ossecret = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (ossecret) ossecret->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}